

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O2

void RenameMemoryToRegister
               (ExpressionContext *ctx,VmModule *module,VmBlock *block,
               SmallArray<VmValue_*,_32U> *stack,VariableData *variable,
               ArrayView<VmInstruction_*> phiNodes)

{
  TypeBase *type;
  VmBlock *pVVar1;
  char *pcVar2;
  VmModule *pVVar3;
  ExpressionContext *pEVar4;
  bool bVar5;
  bool bVar6;
  VmValueType VVar7;
  VmValue **ppVVar8;
  VmInstruction *pVVar9;
  VariableData *variable_00;
  VmValue *pVVar10;
  VmInstruction *pVVar11;
  VmConstant *pVVar12;
  VmBlock **ppVVar13;
  TypeBase *structType;
  uint uVar14;
  uint i;
  uint in_R9D;
  VmInstruction **ppVVar15;
  uint k;
  uint index;
  VmType VVar16;
  ArrayView<VmInstruction_*> phiNodes_00;
  ArrayView<VmInstruction_*> phiNodes_01;
  VmInstruction *local_80;
  uint local_74;
  VmModule *local_70;
  ExpressionContext *local_68;
  VmBlock **local_60;
  uint local_54;
  VmInstruction **local_50;
  SmallArray<VmValue_*,_32U> *local_48;
  SmallArray<VmBlock_*,_4U> *local_40;
  VariableData *local_38;
  
  local_54 = stack->count;
  local_50 = phiNodes.data;
  local_74 = phiNodes.count;
  bVar6 = false;
  ppVVar15 = &block->firstInstruction;
  local_70 = module;
  local_68 = ctx;
  while (pVVar3 = local_70, pVVar11 = *ppVVar15, pVVar11 != (VmInstruction *)0x0) {
    bVar5 = IsMemoryLoadOfVariable(pVVar11,variable);
    if (bVar5) {
      (pVVar11->super_VmValue).canBeRemoved = false;
      if ((block->prevSibling == (VmBlock *)0x0) && (stack->count == 0)) {
        local_80 = pVVar11;
        SmallArray<VmValue_*,_32U>::push_back(stack,(VmValue **)&local_80);
      }
      else {
        ppVVar8 = SmallArray<VmValue_*,_32U>::back(stack);
        anon_unknown.dwarf_20a43d::ReplaceValueUsersWith
                  (local_70,&pVVar11->super_VmValue,*ppVVar8,(uint *)0x0);
      }
      (pVVar11->super_VmValue).canBeRemoved = true;
    }
    bVar5 = IsMemoryStoreToVariable(pVVar11,variable);
    if (bVar5) {
      ppVVar8 = SmallArray<VmValue_*,_4U>::operator[](&pVVar11->arguments,2);
      pVVar9 = (VmInstruction *)*ppVVar8;
      if ((pVVar9 == (VmInstruction *)0x0) || ((pVVar9->super_VmValue).typeID != 2)) {
        ppVVar8 = SmallArray<VmValue_*,_4U>::operator[](&pVVar11->arguments,2);
        pVVar9 = (VmInstruction *)*ppVVar8;
        if ((pVVar9 == (VmInstruction *)0x0) || ((pVVar9->super_VmValue).typeID != 1)) {
          __assert_fail("!\"unknown argument type\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                        ,0x1718,
                        "void RenameMemoryToRegister(ExpressionContext &, VmModule *, VmBlock *, SmallArray<VmValue *, 32> &, VariableData *, ArrayView<VmInstruction *>)"
                       );
        }
      }
      else {
        pcVar2 = (variable->name->name).end;
        (pVVar9->super_VmValue).comment.begin = (variable->name->name).begin;
        (pVVar9->super_VmValue).comment.end = pcVar2;
      }
      local_80 = pVVar9;
      SmallArray<VmValue_*,_32U>::push_back(stack,(VmValue **)&local_80);
      bVar6 = true;
    }
    else {
      phiNodes_00.count = local_74;
      phiNodes_00.data = local_50;
      phiNodes_00._12_4_ = 0;
      bVar5 = IsPhiOfVariable(pVVar11,phiNodes_00);
      if (bVar5) {
        local_80 = pVVar11;
        SmallArray<VmValue_*,_32U>::push_back(stack,(VmValue **)&local_80);
      }
    }
    ppVVar15 = &pVVar11->nextSibling;
  }
  if ((block->prevSibling == (VmBlock *)0x0) && (stack->count == 0)) {
    ppVVar13 = &local_70->currentBlock;
    local_70->currentBlock = block;
    pVVar11 = block->insertPoint;
    structType = (TypeBase *)0x1100000000037;
    while (((pVVar11 != (VmInstruction *)0x0 &&
            (uVar14 = pVVar11->cmd - VM_INST_JUMP, uVar14 < 0x31)) &&
           ((0x1100000000037U >> ((ulong)uVar14 & 0x3f) & 1) != 0))) {
      pVVar11 = pVVar11->prevSibling;
      block->insertPoint = pVVar11;
    }
    bVar6 = IsArgumentVariable(block->parent->function,variable);
    pEVar4 = local_68;
    type = variable->type;
    if (bVar6) {
      local_60 = ppVVar13;
      variable_00 = (VariableData *)ExpressionContext::GetReferenceType(local_68,type);
      pVVar10 = anon_unknown.dwarf_20a43d::CreateVariableAddress
                          (pVVar3,(SynBase *)variable,variable_00,structType);
      ppVVar13 = local_60;
      pVVar11 = (VmInstruction *)
                anon_unknown.dwarf_20a43d::CreateLoad
                          (pEVar4,pVVar3,(SynBase *)0x0,type,pVVar10,in_R9D);
    }
    else {
      VVar16 = GetVmType(local_68,type);
      VVar7 = VVar16.type;
      if (VVar16._0_8_ >> 0x20 == 4 && VVar7 == VM_TYPE_INT) {
        pVVar12 = CreateConstantInt(pVVar3->allocator,(SynBase *)0x0,0);
      }
      else if (VVar16.size == 8 && VVar7 == VM_TYPE_DOUBLE) {
        pVVar12 = CreateConstantDouble(pVVar3->allocator,(SynBase *)0x0,0.0);
      }
      else {
        if ((VVar7 != VM_TYPE_POINTER) && (VVar7 != VM_TYPE_LONG || VVar16.size != 8)) {
          __assert_fail("!\"unknown type\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                        ,0x173e,
                        "void RenameMemoryToRegister(ExpressionContext &, VmModule *, VmBlock *, SmallArray<VmValue *, 32> &, VariableData *, ArrayView<VmInstruction *>)"
                       );
        }
        pVVar12 = CreateConstantLong(pVVar3->allocator,(SynBase *)0x0,0);
      }
      pVVar11 = (VmInstruction *)
                anon_unknown.dwarf_20a43d::CreateLoadImmediate(pVVar3,(SynBase *)0x0,pVVar12);
    }
    pcVar2 = (variable->name->name).end;
    (pVVar11->super_VmValue).comment.begin = (variable->name->name).begin;
    (pVVar11->super_VmValue).comment.end = pcVar2;
    local_80 = (VmInstruction *)0x0;
    if ((pVVar11->super_VmValue).typeID == 2) {
      local_80 = pVVar11;
    }
    SmallArray<VmValue_*,_32U>::push_back(stack,(VmValue **)&local_80);
  }
  else {
    if (!bVar6) goto LAB_00257df7;
    local_70->currentBlock = block;
    block->insertPoint = block->lastInstruction->prevSibling;
    ppVVar8 = SmallArray<VmValue_*,_32U>::back(stack);
    pVVar12 = (VmConstant *)*ppVVar8;
    if ((pVVar12 != (VmConstant *)0x0) && ((pVVar12->super_VmValue).typeID == 1)) {
      pVVar10 = anon_unknown.dwarf_20a43d::CreateLoadImmediate
                          (pVVar3,(pVVar12->super_VmValue).source,pVVar12);
      pcVar2 = (variable->name->name).end;
      (pVVar10->comment).begin = (variable->name->name).begin;
      (pVVar10->comment).end = pcVar2;
      ppVVar8 = SmallArray<VmValue_*,_32U>::back(stack);
      *ppVVar8 = pVVar10;
    }
    ppVVar13 = &pVVar3->currentBlock;
    block->insertPoint = block->lastInstruction;
  }
  *ppVVar13 = (VmBlock *)0x0;
LAB_00257df7:
  local_40 = &block->successors;
  uVar14 = 0;
  local_48 = stack;
  local_38 = variable;
  while( true ) {
    pEVar4 = local_68;
    pVVar3 = local_70;
    if ((block->successors).count <= uVar14) {
      for (uVar14 = 0; uVar14 < (block->dominanceChildren).count; uVar14 = uVar14 + 1) {
        ppVVar13 = SmallArray<VmBlock_*,_4U>::operator[](&block->dominanceChildren,uVar14);
        RenameMemoryToRegister(pEVar4,pVVar3,*ppVVar13,stack,local_38,phiNodes);
      }
      SmallArray<VmValue_*,_32U>::shrink(stack,local_54);
      return;
    }
    local_60 = (VmBlock **)CONCAT44(local_60._4_4_,uVar14);
    ppVVar13 = SmallArray<VmBlock_*,_4U>::operator[](local_40,uVar14);
    pVVar1 = *ppVVar13;
    index = 0;
    uVar14 = 0xffffffff;
    while( true ) {
      stack = local_48;
      if (((pVVar1->predecessors).count <= index) || (uVar14 != 0xffffffff)) break;
      ppVVar13 = SmallArray<VmBlock_*,_4U>::operator[](&pVVar1->predecessors,index);
      uVar14 = 0xffffffff;
      if (*ppVVar13 == block) {
        uVar14 = index;
      }
      index = index + 1;
    }
    if (uVar14 == 0xffffffff) break;
    ppVVar15 = &pVVar1->firstInstruction;
    while ((pVVar11 = *ppVVar15, pVVar11 != (VmInstruction *)0x0 && (pVVar11->cmd == VM_INST_PHI)))
    {
      phiNodes_01.count = local_74;
      phiNodes_01.data = local_50;
      phiNodes_01._12_4_ = 0;
      bVar6 = IsPhiOfVariable(pVVar11,phiNodes_01);
      if (bVar6) {
        ppVVar8 = SmallArray<VmValue_*,_32U>::back(stack);
        pVVar10 = *ppVVar8;
        ppVVar8 = SmallArray<VmValue_*,_4U>::operator[](&pVVar11->arguments,uVar14 * 2);
        *ppVVar8 = pVVar10;
        ppVVar8 = SmallArray<VmValue_*,_32U>::back(stack);
        VmValue::AddUse(*ppVVar8,&pVVar11->super_VmValue);
      }
      ppVVar15 = &pVVar11->nextSibling;
    }
    uVar14 = (int)local_60 + 1;
  }
  __assert_fail("j != ~0u",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                ,0x1768,
                "void RenameMemoryToRegister(ExpressionContext &, VmModule *, VmBlock *, SmallArray<VmValue *, 32> &, VariableData *, ArrayView<VmInstruction *>)"
               );
}

Assistant:

void RenameMemoryToRegister(ExpressionContext &ctx, VmModule *module, VmBlock *block, SmallArray<VmValue*, 32> &stack, VariableData *variable, ArrayView<VmInstruction*> phiNodes)
{
	unsigned oldSize = stack.size();

	bool hadUpdate = false;

	for(VmInstruction *instruction = block->firstInstruction; instruction; instruction = instruction->nextSibling)
	{
		if(IsMemoryLoadOfVariable(instruction, variable))
		{
			// Do not reorder instruction stream, perform a separate dead instruction elimination pass later
			instruction->canBeRemoved = false;

			if(!block->prevSibling && stack.empty())
				stack.push_back(instruction);
			else
				ReplaceValueUsersWith(module, instruction, stack.back(), NULL);

			instruction->canBeRemoved = true;
		}

		if(IsMemoryStoreToVariable(instruction, variable))
		{
			if(VmInstruction *inst = getType<VmInstruction>(instruction->arguments[2]))
			{
				hadUpdate = true;

				inst->comment = variable->name->name;

				stack.push_back(getType<VmInstruction>(inst));
			}
			else if(VmConstant *constant = getType<VmConstant>(instruction->arguments[2]))
			{
				hadUpdate = true;

				stack.push_back(constant);
			}
			else
			{
				assert(!"unknown argument type");
			}
		}
		else if(IsPhiOfVariable(instruction, phiNodes))
		{
			stack.push_back(instruction);
		}
	}

	// If we have completed the entry block and there was no definition of the variable, create an argument load or a constant zero for a local
	if(!block->prevSibling && stack.empty())
	{
		module->currentBlock = block;

		while(block->insertPoint && IsBlockTerminator(block->insertPoint->cmd))
			block->insertPoint = block->insertPoint->prevSibling;

		if(IsArgumentVariable(block->parent->function, variable))
		{
			VmValue *loadInst = CreateLoad(ctx, module, NULL, variable->type, CreateVariableAddress(module, NULL, variable, ctx.GetReferenceType(variable->type)), 0);

			loadInst->comment = variable->name->name;

			stack.push_back(getType<VmInstruction>(loadInst));
		}
		else
		{
			VmValue *loadInst = NULL;

			VmType vmType = GetVmType(ctx, variable->type);

			if(vmType == VmType::Int || (NULLC_PTR_SIZE == 4 && vmType.type == VM_TYPE_POINTER))
				loadInst = CreateLoadImmediate(module, NULL, CreateConstantInt(module->allocator, NULL, 0));
			else if(vmType == VmType::Double)
				loadInst = CreateLoadImmediate(module, NULL, CreateConstantDouble(module->allocator, NULL, 0));
			else if(vmType == VmType::Long || (NULLC_PTR_SIZE == 8 && vmType.type == VM_TYPE_POINTER))
				loadInst = CreateLoadImmediate(module, NULL, CreateConstantLong(module->allocator, NULL, 0));
			else
				assert(!"unknown type");

			loadInst->comment = variable->name->name;

			stack.push_back(getType<VmInstruction>(loadInst));
		}

		module->currentBlock = NULL;
	}
	else if(hadUpdate)
	{
		// Finalize last value before terminator instruction
		module->currentBlock = block;
		block->insertPoint = block->lastInstruction->prevSibling;

		if(VmConstant *constant = getType<VmConstant>(stack.back()))
		{
			// Create immediate load for final constant value
			VmValue *loadInst = CreateLoadImmediate(module, constant->source, constant);

			loadInst->comment = variable->name->name;

			stack.back() = loadInst;
		}

		block->insertPoint = block->lastInstruction;
		module->currentBlock = NULL;
	}

	for(unsigned i = 0; i < block->successors.size(); i++)
	{
		VmBlock *successor = block->successors[i];

		// Find which predecessor is the X for Y
		unsigned j = ~0u;

		for(unsigned k = 0; k < successor->predecessors.size() && j == ~0u; k++)
		{
			if(block == successor->predecessors[k])
				j = k;
		}

		assert(j != ~0u);

		// Find phi node for current variable
		for(VmInstruction *inst = successor->firstInstruction; inst; inst = inst->nextSibling)
		{
			// We won't find any phi instructions after the last one
			if(inst->cmd != VM_INST_PHI)
				break;

			if(IsPhiOfVariable(inst, phiNodes))
			{
				inst->arguments[j * 2] = stack.back();

				stack.back()->AddUse(inst);
			}
		}
	}

	for(unsigned i = 0; i < block->dominanceChildren.size(); i++)
		RenameMemoryToRegister(ctx, module, block->dominanceChildren[i], stack, variable, phiNodes);

	stack.shrink(oldSize);
}